

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O0

void mzd_mul_v_s128_192_1024(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 (*pauVar10) [16];
  long lVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  ulong *puVar15;
  ulong *puVar16;
  long in_RDX;
  word *in_RSI;
  ulong *in_RDI;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  block_t *cblock4;
  block_t *cblock3;
  block_t *cblock2;
  block_t *cblock1;
  word128 mask;
  uint i;
  word idx;
  uint w;
  word128 cval [8];
  block_t *Ablock;
  word *vptr;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  int local_44c;
  word local_448;
  int local_43c;
  ulong local_438 [17];
  long local_3b0;
  word *local_3a8;
  ulong *local_390;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  uint local_200;
  undefined4 local_1fc;
  ulong local_1f8;
  ulong uStack_1f0;
  long local_1e0;
  ulong *local_1d8;
  undefined1 (*local_1d0) [16];
  undefined1 local_1c8 [16];
  ulong local_1b8;
  ulong uStack_1b0;
  uint local_1a0;
  undefined4 local_19c;
  ulong local_198;
  ulong uStack_190;
  long local_180;
  ulong *local_178;
  undefined1 (*local_170) [16];
  undefined1 local_168 [16];
  ulong local_158;
  ulong uStack_150;
  uint local_140;
  undefined4 local_13c;
  ulong local_138;
  ulong uStack_130;
  long local_120;
  ulong *local_118;
  undefined1 (*local_110) [16];
  undefined1 local_108 [16];
  ulong local_f8;
  ulong uStack_f0;
  uint local_e0;
  undefined4 local_dc;
  ulong local_d8;
  ulong uStack_d0;
  long local_c0;
  ulong *local_b8;
  undefined1 (*local_b0) [16];
  undefined1 local_a8 [16];
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  ulong uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ulong local_48;
  ulong uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  ulong local_28;
  ulong uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_218 = (undefined1  [16])0x0;
  local_438[0] = 0;
  local_438[1] = 0;
  local_228 = (undefined1  [16])0x0;
  local_438[2] = 0;
  local_438[3] = 0;
  local_238 = (undefined1  [16])0x0;
  local_438[4] = 0;
  local_438[5] = 0;
  local_248 = (undefined1  [16])0x0;
  local_438[6] = 0;
  local_438[7] = 0;
  local_258 = (undefined1  [16])0x0;
  local_438[8] = 0;
  local_438[9] = 0;
  local_268 = (undefined1  [16])0x0;
  local_438[10] = 0;
  local_438[0xb] = 0;
  local_278 = (undefined1  [16])0x0;
  local_438[0xc] = 0;
  local_438[0xd] = 0;
  local_288 = (undefined1  [16])0x0;
  local_288._0_8_ = 0;
  local_288._8_8_ = 0;
  local_438[0xe] = 0;
  local_438[0xf] = 0;
  uVar17 = local_288._0_8_;
  uVar19 = local_288._8_8_;
  local_3b0 = in_RDX;
  local_3a8 = in_RSI;
  local_390 = in_RDI;
  for (local_43c = 3; local_43c != 0; local_43c = local_43c + -1) {
    local_448 = *local_3a8;
    for (local_44c = 0x40; local_44c != 0; local_44c = local_44c + -1) {
      uVar18 = uVar17;
      uVar20 = uVar19;
      mm128_compute_mask(local_448,0);
      lVar1 = local_3b0;
      local_dc = 2;
      for (local_e0 = 0; local_e0 != 2; local_e0 = local_e0 + 1) {
        uVar17 = local_438[(ulong)local_e0 * 2];
        uVar19 = local_438[(ulong)local_e0 * 2 + 1];
        pauVar10 = (undefined1 (*) [16])(local_3b0 + (ulong)local_e0 * 0x10);
        uVar5 = *(undefined8 *)*pauVar10;
        uVar6 = *(undefined8 *)(*pauVar10 + 8);
        auVar7._8_8_ = uVar20;
        auVar7._0_8_ = uVar18;
        auVar2 = vpand_avx(*pauVar10,auVar7);
        local_a8._0_8_ = auVar2._0_8_;
        local_a8._8_8_ = auVar2._8_8_;
        local_438[(ulong)local_e0 * 2] = uVar17 ^ local_a8._0_8_;
        local_438[(ulong)local_e0 * 2 + 1] = uVar19 ^ local_a8._8_8_;
        local_b0 = pauVar10;
        local_a8 = auVar2;
        local_98 = uVar17;
        uStack_90 = uVar19;
        local_88 = uVar18;
        uStack_80 = uVar20;
        local_78 = uVar5;
        uStack_70 = uVar6;
      }
      puVar14 = local_438 + 4;
      lVar11 = local_3b0 + 0x20;
      local_13c = 2;
      for (local_140 = 0; local_140 != 2; local_140 = local_140 + 1) {
        uVar17 = puVar14[(ulong)local_140 * 2];
        uVar19 = local_438[(ulong)local_140 * 2 + 5];
        pauVar10 = (undefined1 (*) [16])(lVar11 + (ulong)local_140 * 0x10);
        uVar5 = *(undefined8 *)*pauVar10;
        uVar6 = *(undefined8 *)(*pauVar10 + 8);
        auVar8._8_8_ = uVar20;
        auVar8._0_8_ = uVar18;
        auVar2 = vpand_avx(*pauVar10,auVar8);
        local_108._0_8_ = auVar2._0_8_;
        local_108._8_8_ = auVar2._8_8_;
        puVar14[(ulong)local_140 * 2] = uVar17 ^ local_108._0_8_;
        local_438[(ulong)local_140 * 2 + 5] = uVar19 ^ local_108._8_8_;
        local_110 = pauVar10;
        local_108 = auVar2;
        local_f8 = uVar17;
        uStack_f0 = uVar19;
        local_68 = uVar18;
        uStack_60 = uVar20;
        local_58 = uVar5;
        uStack_50 = uVar6;
      }
      puVar15 = local_438 + 8;
      lVar12 = local_3b0 + 0x40;
      local_19c = 2;
      for (local_1a0 = 0; local_1a0 != 2; local_1a0 = local_1a0 + 1) {
        uVar17 = puVar15[(ulong)local_1a0 * 2];
        uVar19 = local_438[(ulong)local_1a0 * 2 + 9];
        pauVar10 = (undefined1 (*) [16])(lVar12 + (ulong)local_1a0 * 0x10);
        uVar5 = *(undefined8 *)*pauVar10;
        uVar6 = *(undefined8 *)(*pauVar10 + 8);
        auVar9._8_8_ = uVar20;
        auVar9._0_8_ = uVar18;
        auVar2 = vpand_avx(*pauVar10,auVar9);
        local_168._0_8_ = auVar2._0_8_;
        local_168._8_8_ = auVar2._8_8_;
        puVar15[(ulong)local_1a0 * 2] = uVar17 ^ local_168._0_8_;
        local_438[(ulong)local_1a0 * 2 + 9] = uVar19 ^ local_168._8_8_;
        local_170 = pauVar10;
        local_168 = auVar2;
        local_158 = uVar17;
        uStack_150 = uVar19;
        local_48 = uVar18;
        uStack_40 = uVar20;
        local_38 = uVar5;
        uStack_30 = uVar6;
      }
      puVar16 = local_438 + 0xc;
      lVar13 = local_3b0 + 0x60;
      local_1fc = 2;
      uVar17 = uVar18;
      uVar19 = uVar20;
      for (local_200 = 0; local_200 != 2; local_200 = local_200 + 1) {
        uVar3 = puVar16[(ulong)local_200 * 2];
        uVar4 = local_438[(ulong)local_200 * 2 + 0xd];
        pauVar10 = (undefined1 (*) [16])(lVar13 + (ulong)local_200 * 0x10);
        uVar5 = *(undefined8 *)*pauVar10;
        uVar6 = *(undefined8 *)(*pauVar10 + 8);
        auVar2._8_8_ = uVar20;
        auVar2._0_8_ = uVar18;
        auVar2 = vpand_avx(*pauVar10,auVar2);
        local_1c8._0_8_ = auVar2._0_8_;
        local_1c8._8_8_ = auVar2._8_8_;
        uVar17 = uVar3 ^ local_1c8._0_8_;
        uVar19 = uVar4 ^ local_1c8._8_8_;
        puVar16[(ulong)local_200 * 2] = uVar17;
        local_438[(ulong)local_200 * 2 + 0xd] = uVar19;
        local_1d0 = pauVar10;
        local_1c8 = auVar2;
        local_1b8 = uVar3;
        uStack_1b0 = uVar4;
        local_28 = uVar18;
        uStack_20 = uVar20;
        local_18 = uVar5;
        uStack_10 = uVar6;
      }
      local_448 = local_448 >> 1;
      local_3b0 = local_3b0 + 0x80;
      local_1f8 = uVar18;
      uStack_1f0 = uVar20;
      local_1e0 = lVar13;
      local_1d8 = puVar16;
      local_198 = uVar18;
      uStack_190 = uVar20;
      local_180 = lVar12;
      local_178 = puVar15;
      local_138 = uVar18;
      uStack_130 = uVar20;
      local_120 = lVar11;
      local_118 = puVar14;
      local_d8 = uVar18;
      uStack_d0 = uVar20;
      local_c0 = lVar1;
      local_b8 = local_438;
    }
    local_3a8 = local_3a8 + 1;
  }
  *local_390 = local_438[0];
  local_390[1] = local_438[1];
  local_390[2] = local_438[2];
  local_390[3] = local_438[3];
  local_390[4] = local_438[4];
  local_390[5] = local_438[5];
  local_390[6] = local_438[6];
  local_390[7] = local_438[7];
  local_390[8] = local_438[8];
  local_390[9] = local_438[9];
  local_390[10] = local_438[10];
  local_390[0xb] = local_438[0xb];
  local_390[0xc] = local_438[0xc];
  local_390[0xd] = local_438[0xd];
  local_390[0xe] = local_438[0xe];
  local_390[0xf] = local_438[0xf];
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_mul_v_s128_192_1024(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  const word* vptr      = CONST_BLOCK(v, 0)->w64;
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word128 cval[8] = {mm128_zero, mm128_zero, mm128_zero, mm128_zero,
                     mm128_zero, mm128_zero, mm128_zero, mm128_zero};
  for (unsigned int w = 3; w; --w, ++vptr) {
    word idx = *vptr;
    for (unsigned int i = sizeof(word) * 8; i; i -= 1, idx >>= 1, Ablock += 4) {
      const word128 mask = mm128_compute_mask(idx, 0);
      mm128_xor_mask_region(&cval[0], Ablock[0].w64, mask, 2);
      mm128_xor_mask_region(&cval[2], Ablock[1].w64, mask, 2);
      mm128_xor_mask_region(&cval[4], Ablock[2].w64, mask, 2);
      mm128_xor_mask_region(&cval[6], Ablock[3].w64, mask, 2);
    }
  }

  block_t* cblock1 = BLOCK(c, 0);
  block_t* cblock2 = BLOCK(c, 1);
  block_t* cblock3 = BLOCK(c, 2);
  block_t* cblock4 = BLOCK(c, 3);
  mm128_store(&cblock1->w64[0], cval[0]);
  mm128_store(&cblock1->w64[2], cval[1]);
  mm128_store(&cblock2->w64[0], cval[2]);
  mm128_store(&cblock2->w64[2], cval[3]);
  mm128_store(&cblock3->w64[0], cval[4]);
  mm128_store(&cblock3->w64[2], cval[5]);
  mm128_store(&cblock4->w64[0], cval[6]);
  mm128_store(&cblock4->w64[2], cval[7]);
}